

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_reduce_scatter_block_
               (void *sendbuf,void *recvbuf,MPIABI_Fint *recvcount,MPIABI_Fint *datatype,
               MPIABI_Fint *op,MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  MPIABI_Fint *comm_local;
  MPIABI_Fint *op_local;
  MPIABI_Fint *datatype_local;
  MPIABI_Fint *recvcount_local;
  void *recvbuf_local;
  void *sendbuf_local;
  
  mpi_reduce_scatter_block_(sendbuf,recvbuf,recvcount,datatype,op,comm,ierror);
  return;
}

Assistant:

void mpiabi_reduce_scatter_block_(
  const void * sendbuf,
  void * recvbuf,
  const MPIABI_Fint * recvcount,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * op,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_reduce_scatter_block_(
    sendbuf,
    recvbuf,
    recvcount,
    datatype,
    op,
    comm,
    ierror
  );
}